

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

int lws_vhost_active_conns(lws *wsi,lws **nwsi,char *adsin)

{
  lws_dll2 *plVar1;
  lws_role_ops *plVar2;
  lws_role_ops *plVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  lws *plVar7;
  uint uVar8;
  int iVar9;
  lws_dll2 *plVar10;
  lws *w;
  int local_44;
  lws_dll2 *local_40;
  lws **local_38;
  
  if ((wsi->dll2_cli_txn_queue).owner == (lws_dll2_owner *)0x0) {
    plVar7 = (wsi->mux).parent_wsi;
    if (plVar7 == (lws *)0x0) {
      local_40 = &wsi->dll2_cli_txn_queue;
      plVar10 = (wsi->vhost->dll_cli_active_conns_owner).head;
      local_38 = nwsi;
      do {
        if (plVar10 == (lws_dll2 *)0x0) {
          iVar9 = 0;
          break;
        }
        plVar1 = plVar10->next;
        w = (lws *)(plVar10 + -0x12);
        iVar9 = 0;
        iVar6 = 0;
        _lws_log(0x10,"%s: check %p %p %s %s %d %d\n","lws_vhost_active_conns",wsi,w,adsin,
                 plVar10[6].owner,(ulong)wsi->c_port,
                 (ulong)*(ushort *)((long)&plVar10[0xc].owner + 6));
        plVar7 = w;
        bVar5 = true;
        if (w != wsi) {
          plVar2 = w->role_ops;
          plVar3 = wsi->role_ops;
          if ((((plVar2 == plVar3) ||
               ((plVar2 == &role_ops_h1 || plVar2 == &role_ops_h2 &&
                (plVar3 == &role_ops_h1 || plVar3 == &role_ops_h2)))) &&
              (iVar9 = iVar6, w->cli_hostname_copy != (char *)0x0)) &&
             (((iVar6 = strcmp(adsin,w->cli_hostname_copy), iVar6 == 0 &&
               ((((plVar7->tls).use_ssl ^ (wsi->tls).use_ssl) & 1) == 0)) &&
              (wsi->c_port == plVar7->c_port)))) {
            uVar4 = *(ulong *)&plVar7->field_0x2dc;
            if ((uVar4 >> 0x33 & 1) == 0) {
              if (((~uVar4 & 0x140000000000000) == 0) &&
                 (((uVar8 = plVar7->wsistate & 0xffff, (short)plVar7->wsistate == 0x11 ||
                   (uVar8 == 0x119)) || (uVar8 == 0x10f)))) {
                _lws_log(4,"%s: just join h2 directly 0x%x\n","lws_vhost_active_conns");
                if ((short)w->wsistate == 0x11) {
                  _lws_generic_transaction_completed_active_conn(&w);
                }
                wsi->field_0x2e2 = wsi->field_0x2e2 | 0x40;
                lws_wsi_h2_adopt(w,wsi);
                *local_38 = w;
                local_44 = 1;
                bVar5 = false;
                iVar9 = 1;
              }
              else if (((plVar3 == &role_ops_mqtt) && ((uVar4 & 0x100000000000000) != 0)) &&
                      (((short)plVar7->wsistate == 0x119 &&
                       (plVar7 = lws_wsi_mqtt_adopt(plVar7,wsi), plVar7 != (lws *)0x0)))) {
                bVar5 = false;
                _lws_log(4,"%s: join mqtt directly\n","lws_vhost_active_conns");
                lws_dll2_remove(local_40);
                wsi->field_0x2e2 = wsi->field_0x2e2 | 0x80;
                local_44 = 1;
                iVar9 = 1;
              }
              else {
                _lws_log(4,"%s: apply %p to txn queue on %p state 0x%lx\n","lws_vhost_active_conns",
                         wsi,w,(ulong)w->wsistate);
                lws_dll2_add_tail(local_40,&w->dll2_cli_txn_queue_owner);
                if ((short)w->wsistate == 0x11) {
                  _lws_generic_transaction_completed_active_conn(&w);
                }
                *local_38 = w;
                local_44 = 2;
                bVar5 = false;
                iVar9 = 1;
              }
            }
            else {
              bVar5 = false;
              iVar9 = 4;
              _lws_log(4,"defeating pipelining due to no keepalive on server\n");
            }
          }
        }
        if (bVar5) {
          iVar9 = 0;
          plVar10 = plVar1;
        }
      } while (iVar9 == 0);
      iVar6 = 0;
      if (iVar9 == 1) {
        iVar6 = local_44;
      }
    }
    else {
      *nwsi = plVar7;
      iVar6 = 1;
    }
  }
  else {
    *nwsi = (lws *)((wsi->dll2_cli_txn_queue).owner + -0x14);
    iVar6 = 2;
  }
  return iVar6;
}

Assistant:

int
lws_vhost_active_conns(struct lws *wsi, struct lws **nwsi, const char *adsin)
{
	if (!lws_dll2_is_detached(&wsi->dll2_cli_txn_queue)) {
		struct lws *w = lws_container_of(
				wsi->dll2_cli_txn_queue.owner, struct lws,
				dll2_cli_txn_queue_owner);
		*nwsi = w;

		return ACTIVE_CONNS_QUEUED;
	}

#if defined(LWS_ROLE_H2) || defined(LWS_ROLE_MQTT)
	if (wsi->mux.parent_wsi) {
		/*
		 * We already decided...
		 */

		*nwsi = wsi->mux.parent_wsi;

		return ACTIVE_CONNS_MUXED;
	}
#endif

	lws_vhost_lock(wsi->vhost); /* ----------------------------------- { */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   wsi->vhost->dll_cli_active_conns_owner.head) {
		struct lws *w = lws_container_of(d, struct lws,
						 dll_cli_active_conns);

		lwsl_debug("%s: check %p %p %s %s %d %d\n", __func__, wsi, w,
			    adsin, w->cli_hostname_copy, wsi->c_port, w->c_port);

		if (w != wsi &&
		    /*
		     * "same internet protocol"... this is a bit tricky,
		     * since h2 start out as h1
		     */
		    (w->role_ops == wsi->role_ops ||
		     (lwsi_role_http(w) && lwsi_role_http(wsi))) &&
		    w->cli_hostname_copy &&
		    !strcmp(adsin, w->cli_hostname_copy) &&
#if defined(LWS_WITH_TLS)
		    (wsi->tls.use_ssl & LCCSCF_USE_SSL) ==
		     (w->tls.use_ssl & LCCSCF_USE_SSL) &&
#endif
		    wsi->c_port == w->c_port) {

			/*
			 * There's already an active connection.
			 *
			 * The server may have told the existing active
			 * connection that it doesn't support pipelining...
			 */
			if (w->keepalive_rejected) {
				lwsl_notice("defeating pipelining due to no "
					  "keepalive on server\n");
				goto solo;
			}

#if defined(LWS_WITH_HTTP2)
			/*
			 * h2: if in usable state already: just use it without
			 *     going through the queue
			 */
			if (w->client_h2_alpn && w->client_mux_migrated &&
			    (lwsi_state(w) == LRS_H2_WAITING_TO_SEND_HEADERS ||
			     lwsi_state(w) == LRS_ESTABLISHED ||
			     lwsi_state(w) == LRS_IDLING)) {

				lwsl_notice("%s: just join h2 directly 0x%x\n",
						__func__, lwsi_state(w));

				if (lwsi_state(w) == LRS_IDLING) {
					// lwsi_set_state(w, LRS_ESTABLISHED);
					_lws_generic_transaction_completed_active_conn(&w);
				}

				//lwsi_set_state(w, LRS_H1C_ISSUE_HANDSHAKE2);

				wsi->client_h2_alpn = 1;
				lws_wsi_h2_adopt(w, wsi);
				lws_vhost_unlock(wsi->vhost); /* } ---------- */

				*nwsi = w;

				return ACTIVE_CONNS_MUXED;
			}
#endif

#if defined(LWS_ROLE_MQTT)
			/*
			 * MQTT: if in usable state already: just use it without
			 *	 going through the queue
			 */

			if (lwsi_role_mqtt(wsi) && w->client_mux_migrated &&
			    lwsi_state(w) == LRS_ESTABLISHED) {

				if (lws_wsi_mqtt_adopt(w, wsi)) {
					lwsl_notice("%s: join mqtt directly\n", __func__);
					lws_dll2_remove(&wsi->dll2_cli_txn_queue);
					wsi->client_mux_substream = 1;

					lws_vhost_unlock(wsi->vhost); /* } ---------- */


					return ACTIVE_CONNS_MUXED;
				}
			}
#endif

			/*
			 * If the connection is viable but not yet in a usable
			 * state, let's attach ourselves to it and wait for it
			 * to get there or fail.
			 */

			lwsl_notice("%s: apply %p to txn queue on %p state 0x%lx\n",
				  __func__, wsi, w, (unsigned long)w->wsistate);
			/*
			 * ...let's add ourselves to his transaction queue...
			 * we are adding ourselves at the TAIL
			 */
			lws_dll2_add_tail(&wsi->dll2_cli_txn_queue,
					  &w->dll2_cli_txn_queue_owner);

			if (lwsi_state(w) == LRS_IDLING) {
				// lwsi_set_state(w, LRS_ESTABLISHED);
				_lws_generic_transaction_completed_active_conn(&w);
			}

			/*
			 * For eg, h1 next we'd pipeline our headers out on him,
			 * and wait for our turn at client transaction_complete
			 * to take over parsing the rx.
			 */
			lws_vhost_unlock(wsi->vhost); /* } ---------- */

			*nwsi = w;

			return ACTIVE_CONNS_QUEUED;
		}

	} lws_end_foreach_dll_safe(d, d1);

solo:
	lws_vhost_unlock(wsi->vhost); /* } ---------------------------------- */

	/* there is nobody already connected in the same way */

	return ACTIVE_CONNS_SOLO;
}